

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_energy.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  fvar<double,_2UL> beta;
  long lVar1;
  istream *piVar2;
  ostream *poVar3;
  char *this;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  real_t t_step;
  real_t t_max;
  real_t t_min;
  fvar<double,_2UL> result;
  
  if (argc == 1) {
    piVar2 = std::istream::_M_extract<double>((double *)&std::cin);
    piVar2 = std::istream::_M_extract<double>((double *)piVar2);
    piVar2 = std::istream::_M_extract<double>((double *)piVar2);
    piVar2 = std::istream::_M_extract<double>((double *)piVar2);
    piVar2 = std::istream::_M_extract<double>((double *)piVar2);
    std::istream::_M_extract<double>((double *)piVar2);
  }
  else {
    if (argc != 7) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
      poVar3 = std::operator<<(poVar3,*argv);
      std::operator<<(poVar3," [Ja Jb Jc t_min t_max t_step]\n");
      return 0x7f;
    }
    Ja = boost::lexical_cast<double,char*>(argv + 1);
    Jb = boost::lexical_cast<double,char*>(argv + 2);
    Jc = boost::lexical_cast<double,char*>(argv + 3);
    t_min = boost::lexical_cast<double,char*>(argv + 4);
    t_max = boost::lexical_cast<double,char*>(argv + 5);
    t_step = boost::lexical_cast<double,char*>(argv + 6);
  }
  lVar1 = std::cout;
  *(uint *)(std::runtime_error::what + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::what + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0xf;
  std::operator<<((ostream *)&std::cout,"# triangular lattice Ising model\n");
  this = "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n";
  std::operator<<((ostream *)&std::cout,
                  "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n");
  for (; t_min <= t_max; t_min = t_min + t_step) {
    beta.v._M_elems[1] = 1.0;
    beta.v._M_elems[0] = 1.0 / t_min;
    beta.v._M_elems[2] = 0.0;
    ising::free_energy::triangular::
    infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
              (&result,(triangular *)this,Ja,Jb,Jc,beta);
    poVar3 = std::ostream::_M_insert<double>(Ja);
    std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<double>(Jb);
    std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<double>(Jc);
    std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<double>(t_min);
    poVar3 = std::operator<<(poVar3,' ');
    this = (char *)&result;
    poVar3 = boost::math::differentiation::autodiff_v1::detail::operator<<
                       (poVar3,(fvar<double,_2UL> *)&result);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  typedef double real_t;
  real_t Ja, Jb, Jc, t_min, t_max, t_step;
  if (argc == 7) {
    Ja = boost::lexical_cast<real_t>(argv[1]);
    Jb = boost::lexical_cast<real_t>(argv[2]);
    Jc = boost::lexical_cast<real_t>(argv[3]);
    t_min = boost::lexical_cast<real_t>(argv[4]);
    t_max = boost::lexical_cast<real_t>(argv[5]);
    t_step = boost::lexical_cast<real_t>(argv[6]);
  } else if (argc == 1) {
    std::cin >> Ja >> Jb >> Jc >> t_min >> t_max >> t_step;
  } else {
    std::cerr << "Usage: " << argv[0] << " [Ja Jb Jc t_min t_max t_step]\n";
    return 127;
  }
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10);
  std::cout << "# triangular lattice Ising model\n";
  std::cout << "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n";
  for (real_t t = t_min; t <= t_max; t += t_step) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto result = ising::free_energy::triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' ' << result << std::endl;
  }
}